

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O3

void __thiscall
apngasm::APNGAsm::write_chunk(APNGAsm *this,FILE *f,char *name,uchar *data,uint length)

{
  uchar *puVar1;
  undefined4 uVar2;
  uchar buf [4];
  undefined1 local_3c [4];
  uchar *local_38;
  
  local_38 = data;
  uVar2 = crc32(0,0,0);
  png_save_uint_32(local_3c,length);
  fwrite(local_3c,1,4,(FILE *)f);
  fwrite(name,1,4,(FILE *)f);
  uVar2 = crc32(uVar2,name,4);
  if (*(int *)name == 0x54416466) {
    this->_next_seq_num = this->_next_seq_num + 1;
    png_save_uint_32(local_3c);
    fwrite(local_3c,1,4,(FILE *)f);
    uVar2 = crc32(uVar2,local_3c,4);
    length = length - 4;
  }
  puVar1 = local_38;
  if (length != 0 && local_38 != (uchar *)0x0) {
    fwrite(local_38,1,(ulong)length,(FILE *)f);
    uVar2 = crc32(uVar2,puVar1,length);
  }
  png_save_uint_32(local_3c,uVar2);
  fwrite(local_3c,1,4,(FILE *)f);
  return;
}

Assistant:

void APNGAsm::write_chunk(FILE * f, const char * name, unsigned char * data, unsigned int length)
  {
    unsigned char buf[4];
    unsigned int crc = crc32(0, Z_NULL, 0);

    png_save_uint_32(buf, length);
    fwrite(buf, 1, 4, f);
    fwrite(name, 1, 4, f);
    crc = crc32(crc, (const Bytef *)name, 4);

    if (memcmp(name, "fdAT", 4) == 0)
    {
      png_save_uint_32(buf, _next_seq_num++);
      fwrite(buf, 1, 4, f);
      crc = crc32(crc, buf, 4);
      length -= 4;
    }

    if (data != NULL && length > 0)
    {
      fwrite(data, 1, length, f);
      crc = crc32(crc, data, length);
    }

    png_save_uint_32(buf, crc);
    fwrite(buf, 1, 4, f);
  }